

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

int NULLC::CompareObjects(NULLCRef l,NULLCRef r)

{
  int iVar1;
  ExternTypeInfo *pEVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  FastVector<char,_false,_false> *pFVar6;
  uint in_stack_00000008;
  void *in_stack_0000000c;
  uint in_stack_00000018;
  void *in_stack_0000001c;
  
  if (in_stack_00000008 == in_stack_00000018) {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    iVar1 = bcmp(in_stack_0000000c,in_stack_0000001c,(ulong)pEVar2->size);
    uVar5 = (uint)(iVar1 == 0);
  }
  else {
    pFVar6 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000018);
    pcVar3 = FastVector<char,_false,_false>::operator[](pFVar6,pEVar2->offsetToName);
    pFVar6 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    pcVar4 = FastVector<char,_false,_false>::operator[](pFVar6,pEVar2->offsetToName);
    uVar5 = 0;
    nullcThrowError("ERROR: types don\'t match (%s ref, %s ref)",pcVar3,pcVar4);
  }
  return uVar5;
}

Assistant:

int NULLC::CompareObjects(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: types don't match (%s ref, %s ref)", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return 0;
	}
	return 0 == memcmp(l.ptr, r.ptr, linker->exTypes[l.typeID].size);
}